

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O1

bool Js::VarIsImpl<Js::DynamicObject>(RecyclableObject *obj)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  
  bVar2 = DynamicType::Is(((obj->type).ptr)->typeId);
  iVar4 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [0x5b])(obj);
  if (bVar2 != (bool)(char)iVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0xad,"(result == obj->DbgIsDynamicObject())",
                                "result == obj->DbgIsDynamicObject()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return bVar2;
}

Assistant:

bool VarIsImpl<DynamicObject>(RecyclableObject* obj)
    {
        bool result = DynamicType::Is(obj->GetTypeId());
        Assert(result == obj->DbgIsDynamicObject());
        return result;
    }